

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

spv_result_t __thiscall
anon_unknown.dwarf_490c93::Parser::setNumericTypeInfoForType
          (Parser *this,spv_parsed_operand_t *parsed_operand,uint32_t type_id)

{
  spv_number_kind_t sVar1;
  uint32_t uVar2;
  __node_ptr p_Var3;
  __hash_code in_RCX;
  long lVar4;
  char *pcVar5;
  uint32_t local_1f4;
  DiagnosticStream local_1f0;
  
  local_1f4 = type_id;
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                  ,0x32b,
                  "spv_result_t (anonymous namespace)::Parser::setNumericTypeInfoForType(spv_parsed_operand_t *, uint32_t)"
                 );
  }
  p_Var3 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_std::allocator<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(&(this->_).type_id_to_number_type_info._M_h,
                          (ulong)type_id %
                          (this->_).type_id_to_number_type_info._M_h._M_bucket_count,&local_1f4,
                          in_RCX);
  if (p_Var3 == (__node_ptr)0x0) {
    diagnostic(&local_1f0,this,SPV_ERROR_INVALID_BINARY);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"Type Id ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
    pcVar5 = " is not a type";
    lVar4 = 0xe;
  }
  else {
    sVar1 = *(spv_number_kind_t *)
             ((long)&(p_Var3->
                     super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                     ).
                     super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                     ._M_storage._M_storage + 4);
    if (sVar1 != SPV_NUMBER_NONE) {
      parsed_operand->number_kind = sVar1;
      uVar2 = *(uint32_t *)
               ((long)&(p_Var3->
                       super__Hash_node_value<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_(anonymous_namespace)::Parser::NumberType>_>
                       ._M_storage._M_storage + 8);
      parsed_operand->number_bit_width = uVar2;
      parsed_operand->num_words = (uint16_t)(uVar2 + 0x1f >> 5);
      return SPV_SUCCESS;
    }
    diagnostic(&local_1f0,this,SPV_ERROR_INVALID_BINARY);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,"Type Id ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1f0);
    pcVar5 = " is not a scalar numeric type";
    lVar4 = 0x1d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f0,pcVar5,lVar4);
  spvtools::DiagnosticStream::~DiagnosticStream(&local_1f0);
  return local_1f0.error_;
}

Assistant:

spv_result_t Parser::setNumericTypeInfoForType(
    spv_parsed_operand_t* parsed_operand, uint32_t type_id) {
  assert(type_id != 0);
  auto type_info_iter = _.type_id_to_number_type_info.find(type_id);
  if (type_info_iter == _.type_id_to_number_type_info.end()) {
    return diagnostic() << "Type Id " << type_id << " is not a type";
  }
  const NumberType& info = type_info_iter->second;
  if (info.type == SPV_NUMBER_NONE) {
    // This is a valid type, but for something other than a scalar number.
    return diagnostic() << "Type Id " << type_id
                        << " is not a scalar numeric type";
  }

  parsed_operand->number_kind = info.type;
  parsed_operand->number_bit_width = info.bit_width;
  // Round up the word count.
  parsed_operand->num_words = static_cast<uint16_t>((info.bit_width + 31) / 32);
  return SPV_SUCCESS;
}